

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O0

Name __thiscall
wasm::JSPI::makeWrapperForExport(JSPI *this,Function *func,Module *module,Name suspender)

{
  pointer *this_00;
  size_t *this_01;
  string_view sVar1;
  bool bVar2;
  Call *item;
  Type TVar3;
  size_type sVar4;
  Block *this_02;
  LocalGet *pLVar5;
  GlobalSet *item_00;
  Const *item_01;
  Function *pFVar6;
  Name NVar7;
  Iterator IVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_258;
  Function *local_238;
  Tuple local_230;
  Type local_218;
  Signature local_210;
  HeapType local_200;
  char *local_1f8;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *pvStack_1f0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_1e0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> wrapperFunc;
  BasicType local_1cc;
  _Head_base<0UL,_wasm::Function_*,_false> local_1c8;
  Type resultsType;
  Block *block;
  char *local_190;
  uintptr_t local_188;
  Type *local_180;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  undefined1 auStack_140 [4];
  Index i;
  string_view local_130;
  undefined1 local_120 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedWrapperParams;
  vector<wasm::Type,_std::allocator<wasm::Type>_> wrapperParams;
  Call *call;
  Builder builder;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_view local_60;
  char *pcStack_50;
  Name wrapperName;
  Module *module_local;
  Function *func_local;
  JSPI *this_local;
  Name suspender_local;
  
  wrapperName.super_IString.str._M_str = (char *)module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"export$",&local_a1);
  IString::toString_abi_cxx11_((string *)&builder,(IString *)func);
  std::operator+(&local_80,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder);
  wasm::Name::Name((Name *)&local_60,&local_80);
  NVar7 = Names::getValidFunctionName(module,(Name)local_60);
  wrapperName.super_IString.str._M_len = NVar7.super_IString.str._M_str;
  pcStack_50 = NVar7.super_IString.str._M_len;
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Builder::Builder((Builder *)&call,(Module *)wrapperName.super_IString.str._M_str);
  item = MixedArena::alloc<wasm::Call>((MixedArena *)(wrapperName.super_IString.str._M_str + 0x158))
  ;
  wasm::Name::operator=(&item->target,(Name *)func);
  TVar3 = Function::getResults(func);
  (item->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = TVar3.id;
  this_00 = &namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)this_00);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_120);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)this_00,&this->externref);
  wasm::Name::Name((Name *)auStack_140,"susp");
  local_130 = (string_view)Names::getValidLocalName(func,(Name)_auStack_140);
  std::vector<wasm::NameType,std::allocator<wasm::NameType>>::emplace_back<wasm::Name,wasm::Type&>
            ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)local_120,(Name *)&local_130,
             &this->externref);
  __range2._4_4_ = 0;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(func);
  this_01 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  IVar8 = wasm::Type::begin((Type *)this_01);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          wasm::Type::end((Type *)this_01);
  while( true ) {
    __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar9.index;
    param = PVar9.parent;
    bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &param);
    if (!bVar2) break;
    local_180 = wasm::Type::Iterator::operator*
                          ((Iterator *)
                           &__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
    sVar4 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                       &namedWrapperParams.
                        super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    local_188 = local_180->id;
    pLVar5 = Builder::makeLocalGet((Builder *)&call,(Index)sVar4,(Type)local_188);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(item->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar5);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               &namedWrapperParams.
                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_180);
    NVar7 = Function::getLocalNameOrGeneric(func,__range2._4_4_);
    local_190 = NVar7.super_IString.str._M_str;
    block = NVar7.super_IString.str._M_len;
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<wasm::Name,wasm::Type_const&>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)local_120,(Name *)&block,
               local_180);
    __range2._4_4_ = __range2._4_4_ + 1;
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar9.index = (size_t)__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar9.parent = param;
  }
  this_02 = Builder::makeBlock((Builder *)&call,(Expression *)0x0);
  resultsType.id = (this->externref).id;
  pLVar5 = Builder::makeLocalGet((Builder *)&call,0,resultsType);
  item_00 = Builder::makeGlobalSet((Builder *)&call,suspender,(Expression *)pLVar5);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_02->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_00);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_02->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  local_1c8._M_head_impl = (Function *)Function::getResults(func);
  local_1cc = none;
  bVar2 = wasm::Type::operator==((Type *)&local_1c8,&local_1cc);
  if (bVar2) {
    wasm::Type::Type((Type *)&wrapperFunc,i32);
    local_1c8._M_head_impl =
         (Function *)
         wrapperFunc._M_t.
         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    item_01 = Builder::makeConst<int>((Builder *)&call,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_02->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item_01);
  }
  Block::finalize(this_02);
  local_1f8 = pcStack_50;
  pvStack_1f0 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                wrapperName.super_IString.str._M_len;
  Tuple::Tuple(&local_230,
               (TypeList *)
               &namedWrapperParams.
                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  wasm::Type::Type(&local_218,&local_230);
  local_238 = local_1c8._M_head_impl;
  Signature::Signature(&local_210,local_218,(Type)local_1c8._M_head_impl);
  HeapType::HeapType(&local_200,local_210);
  local_258.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_258);
  NVar7.super_IString.str._M_str = local_1f8;
  NVar7.super_IString.str._M_len = (size_t)&local_1e0;
  Builder::makeFunction
            (NVar7,pvStack_1f0,(HeapType)local_120,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_200.id,
             (Expression *)&local_258);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_258);
  Tuple::~Tuple(&local_230);
  pFVar6 = Module::addFunction((Module *)wrapperName.super_IString.str._M_str,&local_1e0);
  sVar1 = (pFVar6->super_Importable).super_Named.name.super_IString.str;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_1e0);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_120);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             &namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (IString)(IString)sVar1;
}

Assistant:

Name makeWrapperForExport(Function* func, Module* module, Name suspender) {
    Name wrapperName = Names::getValidFunctionName(
      *module, std::string("export$") + func->name.toString());

    Builder builder(*module);

    auto* call = module->allocator.alloc<Call>();
    call->target = func->name;
    call->type = func->getResults();

    // Add an externref param as the first argument and copy all the original
    // params to new export.
    std::vector<Type> wrapperParams;
    std::vector<NameType> namedWrapperParams;
    wrapperParams.push_back(externref);
    namedWrapperParams.emplace_back(Names::getValidLocalName(*func, "susp"),
                                    externref);
    Index i = 0;
    for (const auto& param : func->getParams()) {
      call->operands.push_back(
        builder.makeLocalGet(wrapperParams.size(), param));
      wrapperParams.push_back(param);
      namedWrapperParams.emplace_back(func->getLocalNameOrGeneric(i), param);
      i++;
    }
    auto* block = builder.makeBlock();
    block->list.push_back(
      builder.makeGlobalSet(suspender, builder.makeLocalGet(0, externref)));
    block->list.push_back(call);
    Type resultsType = func->getResults();
    if (resultsType == Type::none) {
      // A void return is not currently allowed by v8. Add an i32 return value
      // that is ignored.
      // https://bugs.chromium.org/p/v8/issues/detail?id=13231
      resultsType = Type::i32;
      block->list.push_back(builder.makeConst(0));
    }
    block->finalize();
    auto wrapperFunc =
      Builder::makeFunction(wrapperName,
                            std::move(namedWrapperParams),
                            Signature(Type(wrapperParams), resultsType),
                            {},
                            block);
    return module->addFunction(std::move(wrapperFunc))->name;
  }